

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_test.cpp
# Opt level: O0

void __thiscall
Properties_Tolerance_Test::~Properties_Tolerance_Test(Properties_Tolerance_Test *this)

{
  Properties_Tolerance_Test *this_local;
  
  ~Properties_Tolerance_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Properties, Tolerance) {
  double degrees = 1;
  double tol = sind(degrees);
  Manifold cube = Manifold::Cube({1, 1, 1}, true);
  Manifold imperfect = (cube ^ cube.Rotate(degrees)).AsOriginal();
  EXPECT_EQ(imperfect.NumTri(), 28);

  Manifold imperfect2 = imperfect.Simplify(tol);
  EXPECT_EQ(imperfect2.NumTri(), 12);

  MeshGL mesh = imperfect.GetMeshGL();
  mesh.tolerance = tol;
  Manifold imperfect3(mesh);
  EXPECT_EQ(imperfect3.NumTri(), 28);  // Don't automatically simplify

  EXPECT_NEAR(imperfect.Volume(), imperfect2.Volume(), 0.01);
  EXPECT_NEAR(imperfect.SurfaceArea(), imperfect2.SurfaceArea(), 0.02);
  EXPECT_NEAR(imperfect2.Volume(), imperfect3.Volume(), 0.01);
  EXPECT_NEAR(imperfect2.SurfaceArea(), imperfect3.SurfaceArea(), 0.02);

#ifdef MANIFOLD_EXPORT
  if (options.exportModels) {
    ExportMesh("tolerance.glb", imperfect2.GetMeshGL(), {});
    ExportMesh("tolerance2.glb", imperfect3.GetMeshGL(), {});
  }
#endif
}